

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O1

vector bucket_get_pairs_value(bucket b,comparable_callback compare_cb,void *key)

{
  pair ppVar1;
  int iVar2;
  vector v;
  long lVar3;
  ulong uVar4;
  
  if (b->pairs == (pair)0x0) {
    return (vector)0x0;
  }
  lVar3 = 8;
  v = vector_create(8);
  if (b->count != 0) {
    uVar4 = 0;
    do {
      ppVar1 = b->pairs;
      iVar2 = (*compare_cb)(key,*(comparable *)((long)ppVar1 + lVar3 + -8));
      if (iVar2 == 0) {
        vector_push_back(v,(void *)((long)&ppVar1->key + lVar3));
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < b->count);
  }
  return v;
}

Assistant:

vector bucket_get_pairs_value(bucket b, comparable_callback compare_cb, void *key)
{
	size_t iterator;
	vector v;

	if (b->pairs == NULL)
	{
		return NULL;
	}

	v = vector_create(sizeof(void *));

	for (iterator = 0; iterator < b->count; ++iterator)
	{
		pair p = &b->pairs[iterator];

		if (compare_cb(key, p->key) == 0)
		{
			vector_push_back(v, &p->value);
		}
	}

	return v;
}